

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.cc
# Opt level: O0

string * bitset_to_byte_array_abi_cxx11_
                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *message)

{
  bool bVar1;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  string *in_RDI;
  format f_1;
  size_t j_1;
  size_t i;
  format f;
  size_t j;
  uint8_t byte;
  string *ret;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string local_250 [36];
  uint local_22c;
  char *in_stack_fffffffffffffdf8;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  ulong local_148;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  string local_138 [36];
  uint local_114;
  ulong local_20;
  byte local_12;
  byte local_11;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  local_12 = 0;
  for (local_20 = 0; local_20 < 8; local_20 = local_20 + 1) {
    local_12 = local_12 * '\x02';
    bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffd90,
                       CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    local_12 = local_12 | bVar1;
  }
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  local_114 = (uint)local_12;
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::operator%
            (in_stack_fffffffffffffd90,
             (int *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
  boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
            (in_stack_fffffffffffffe08);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(local_138);
  local_140 = (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
  while (this = local_140,
        pbVar2 = (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::size
                           (local_10), this < pbVar2) {
    local_12 = 0;
    for (local_148 = 0; local_148 < 8; local_148 = local_148 + 1) {
      local_12 = local_12 * '\x02';
      in_stack_fffffffffffffd8f =
           boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)this,
                      CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
      local_12 = local_12 | in_stack_fffffffffffffd8f;
    }
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    local_22c = (uint)local_12;
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::operator%
              (this,(int *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (in_stack_fffffffffffffe08);
    std::__cxx11::string::append((string *)in_RDI);
    std::__cxx11::string::~string(local_250);
    boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format(this);
    local_140 = (basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &(local_140->items_).
                 super__Vector_base<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<boost::io::detail::format_item<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_11 = 1;
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format(this);
  if ((local_11 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string bitset_to_byte_array(boost::dynamic_bitset<> const & message) {

  std::string ret;

  uint8_t byte = 0;
  
  // for the first byte
  for(size_t j = 0; j < 8; j++) {
    byte <<= 1;
    byte |= (message[j] == true ? 1 : 0); 
  }

  boost::format f("0x%02x");
  f % static_cast<int>(byte);
  ret.append(f.str());

  // for all subsequent bytes
  for(size_t i = 8; i < message.size(); i+=8) {

    byte = 0;

    for(size_t j = 0; j < 8; j++) {
      byte <<= 1;
      byte |= (message[i + j] == true ? 1 : 0);
    }

    boost::format f(", 0x%02x");
    f % static_cast<int>(byte);
    ret.append(f.str());

  }

  return ret;
}